

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels(uchar *pixels,int type,int w,int h,int stride,Allocator *allocator)

{
  uint in_EDX;
  Mat *in_RDI;
  Mat *m;
  int in_stack_0000005c;
  uchar *in_stack_00000068;
  Allocator *in_stack_000000b8;
  Mat *in_stack_000000c0;
  int in_stack_000000cc;
  int in_stack_000000d0;
  int in_stack_000000d4;
  uchar *in_stack_000000d8;
  Allocator *in_stack_000000e8;
  Mat *in_stack_000000f0;
  int in_stack_000000fc;
  int in_stack_00000100;
  int in_stack_00000104;
  uchar *in_stack_00000108;
  Allocator *in_stack_00000118;
  Mat *in_stack_00000120;
  int in_stack_0000012c;
  int in_stack_00000130;
  int in_stack_00000134;
  uchar *in_stack_00000138;
  Mat *m_00;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  
  uVar1 = 0;
  m_00 = in_RDI;
  Mat(in_RDI);
  if ((in_EDX & 0xffff0000) == 0) {
    if ((in_EDX == 1) || (in_EDX == 2)) {
      from_rgb(in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,
               in_stack_000000c0,in_stack_000000b8);
    }
    if (in_EDX == 3) {
      from_gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI);
    }
    if ((in_EDX != 4) && (in_EDX != 5)) {
      return m_00;
    }
    from_rgba(in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_0000012c,
              in_stack_00000120,in_stack_00000118);
    return m_00;
  }
  if (in_EDX == 0x10002) {
LAB_00150589:
    from_rgb2bgr(in_stack_00000108,in_stack_00000104,in_stack_00000100,in_stack_000000fc,
                 in_stack_000000f0,in_stack_000000e8);
    return m_00;
  }
  if (in_EDX == 0x10003) {
LAB_00150669:
    from_gray2rgb(in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,
                  in_stack_000000c0,in_stack_000000b8);
    return m_00;
  }
  if (in_EDX == 0x10004) {
LAB_001506b7:
    from_rgba2rgb(in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,
                  in_stack_000000c0,in_stack_000000b8);
    return m_00;
  }
  if (in_EDX != 0x10005) {
    if (in_EDX == 0x20001) goto LAB_00150589;
    if (in_EDX == 0x20003) goto LAB_00150669;
    if (in_EDX != 0x20004) {
      if (in_EDX == 0x20005) goto LAB_001506b7;
      if (in_EDX == 0x30001) {
        from_rgb2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI);
        return m_00;
      }
      if (in_EDX == 0x30002) {
        from_bgr2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI);
        return m_00;
      }
      if (in_EDX == 0x30004) {
        from_rgba2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI)
        ;
        return m_00;
      }
      if (in_EDX == 0x30005) {
        from_bgra2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI)
        ;
        return m_00;
      }
      if (in_EDX == 0x40001) {
LAB_001505f4:
        from_rgb2rgba(in_stack_00000068,allocator._4_4_,(int)allocator,in_stack_0000005c,m,
                      (Allocator *)pixels);
        return m_00;
      }
      if (in_EDX != 0x40002) {
        if (in_EDX == 0x40003) {
LAB_00150690:
          from_gray2rgba(in_stack_00000068,allocator._4_4_,(int)allocator,in_stack_0000005c,m,
                         (Allocator *)pixels);
          return m_00;
        }
        if (in_EDX != 0x40005) {
          if (in_EDX == 0x50001) goto LAB_00150642;
          if (in_EDX == 0x50002) goto LAB_001505f4;
          if (in_EDX == 0x50003) goto LAB_00150690;
          if (in_EDX != 0x50004) {
            fprintf(_stderr,"unimplemented convert type %d",(ulong)in_EDX);
            fprintf(_stderr,"\n");
            return m_00;
          }
        }
        from_rgba2bgra(in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_0000012c,
                       in_stack_00000120,in_stack_00000118);
        return m_00;
      }
LAB_00150642:
      from_bgr2rgba(in_stack_00000068,allocator._4_4_,(int)allocator,in_stack_0000005c,m,
                    (Allocator *)pixels);
      return m_00;
    }
  }
  from_rgba2bgr(in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,
                in_stack_000000c0,in_stack_000000b8);
  return m_00;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}